

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O2

void so_5::ensure_message_with_actual_data<so_5::user_type_message_t<so_5::coop_t*>>
               (user_type_message_t<so_5::coop_t_*> *m)

{
  exception_t *this;
  allocator local_39;
  string local_38;
  
  if (m != (user_type_message_t<so_5::coop_t_*> *)0x0) {
    return;
  }
  this = (exception_t *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string
            ((string *)&local_38,"an attempt to send a message via nullptr",&local_39);
  exception_t::exception_t(this,&local_38,0x52);
  __cxa_throw(this,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

void
ensure_message_with_actual_data( const MSG * m )
{
	ensure_not_signal< MSG >();

	if( !m )
		throw so_5::exception_t(
				"an attempt to send a message via nullptr",
				so_5::rc_null_message_data );
}